

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O0

string * __thiscall
flatbuffers::ToHex_abi_cxx11_(string *__return_storage_ptr__,flatbuffers *this,uint8_t i)

{
  uint8_t i_local;
  
  ToHex<int>(__return_storage_ptr__,(uint)(byte)this,2);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string ToHex(uint8_t i) {
  return ToHex<int>(static_cast<int>(i), 2);
}